

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O2

void variance_partition_alloc(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  VP64x64 *pVVar2;
  int iVar3;
  size_t size;
  
  BVar1 = ((cpi->common).seq_params)->sb_size;
  iVar3 = (uint)(BVar1 != BLOCK_64X64) * 3 + 1;
  pVVar2 = (cpi->td).vt64x64;
  if (pVVar2 != (VP64x64 *)0x0) {
    if (iVar3 == (cpi->td).num_64x64_blocks) {
      return;
    }
    aom_free(pVVar2);
    (cpi->td).vt64x64 = (VP64x64 *)0x0;
  }
  size = 0x2aa40;
  if (BVar1 == BLOCK_64X64) {
    size = 0xaa90;
  }
  pVVar2 = (VP64x64 *)aom_malloc(size);
  (cpi->td).vt64x64 = pVVar2;
  if (pVVar2 == (VP64x64 *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate cpi->td.vt64x64")
    ;
  }
  (cpi->td).num_64x64_blocks = iVar3;
  return;
}

Assistant:

static inline void variance_partition_alloc(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_64x64_blocks = (cm->seq_params->sb_size == BLOCK_64X64) ? 1 : 4;
  if (cpi->td.vt64x64) {
    if (num_64x64_blocks != cpi->td.num_64x64_blocks) {
      aom_free(cpi->td.vt64x64);
      cpi->td.vt64x64 = NULL;
    }
  }
  if (!cpi->td.vt64x64) {
    CHECK_MEM_ERROR(cm, cpi->td.vt64x64,
                    aom_malloc(sizeof(*cpi->td.vt64x64) * num_64x64_blocks));
    cpi->td.num_64x64_blocks = num_64x64_blocks;
  }
}